

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool CheckFunctionForInlining(VmFunction *function)

{
  VmInstructionType VVar1;
  uint uVar2;
  VmBlock *pVVar3;
  VmValue **ppVVar4;
  VmFunction *pVVar5;
  VmInstruction *pVVar6;
  uint uVar7;
  bool bVar8;
  
  pVVar3 = function->firstBlock;
  if (((pVVar3 == (VmBlock *)0x0) || ((function->restoreBlocks).count != 0)) ||
     (bVar8 = pVVar3->nextSibling == (VmBlock *)0x0, !bVar8)) {
LAB_001a1c50:
    bVar8 = false;
  }
  else {
    pVVar6 = pVVar3->firstInstruction;
    if (pVVar6 == (VmInstruction *)0x0) {
      bVar8 = true;
    }
    else {
      uVar7 = 0;
      do {
        VVar1 = pVVar6->cmd;
        if (VVar1 == VM_INST_CALL) {
          uVar2 = (pVVar6->arguments).count;
          if (uVar2 == 0) {
LAB_001a1cd0:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                         );
          }
          ppVVar4 = (pVVar6->arguments).data;
          if (((*ppVVar4)->type).type != VM_TYPE_FUNCTION_REF) {
            if (uVar2 == 1) goto LAB_001a1cd0;
            pVVar5 = (VmFunction *)ppVVar4[1];
            if ((pVVar5 == (VmFunction *)0x0) || ((pVVar5->super_VmValue).typeID != 4)) {
              pVVar5 = (VmFunction *)0x0;
            }
            if (pVVar5 == function) goto LAB_001a1c50;
          }
        }
        else {
          if (VVar1 == VM_INST_YIELD) {
            return false;
          }
          if (VVar1 == VM_INST_ABORT_NO_RETURN) {
            return false;
          }
        }
        uVar7 = uVar7 + 1;
        if (0x10 < uVar7) goto LAB_001a1c50;
        pVVar6 = pVVar6->nextSibling;
      } while (pVVar6 != (VmInstruction *)0x0);
    }
  }
  return bVar8;
}

Assistant:

bool CheckFunctionForInlining(VmFunction *function)
{
	// Can't inline external function
	if(!function->firstBlock)
		return false;

	// Can't inline coroutines
	if(!function->restoreBlocks.empty())
		return false;

	unsigned instructions = 0;

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		// TODO: remove single block limit
		if(curr->nextSibling)
			return false;

		for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_ABORT_NO_RETURN || inst->cmd == VM_INST_YIELD)
				return false;

			if(inst->cmd == VM_INST_CALL && inst->arguments[0]->type.type != VM_TYPE_FUNCTION_REF)
			{
				VmFunction *targetFunction = getType<VmFunction>(inst->arguments[1]);

				// Can't inline recursive call
				if(function == targetFunction)
					return false;
			}

			// Simplest heuristic, inline small functions
			if(++instructions > 16)
				return false;
		}
	}

	return true;
}